

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericDatum.hh
# Opt level: O3

void __thiscall
avro::GenericDatum::GenericDatum<avro::GenericMap>(GenericDatum *this,NodePtr *schema,GenericMap *v)

{
  GenericMap *this_00;
  
  this->type_ = schema->px->type_;
  (this->value_).content = (placeholder *)0x0;
  init(this,(EVP_PKEY_CTX *)schema);
  this_00 = boost::any_cast<avro::GenericMap>(&this->value_);
  boost::shared_ptr<avro::Node>::operator=
            ((shared_ptr<avro::Node> *)this_00,(shared_ptr<avro::Node> *)v);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_>_>
  ::operator=(&this_00->value_,&v->value_);
  return;
}

Assistant:

GenericDatum(const NodePtr& schema, const T& v) :
        type_(schema->type()) {
        init(schema);
        value<T>() = v;
    }